

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33ab2::
ARTCorrectnessTest_Node48ShrinkToNode16DeleteMiddle_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Node48ShrinkToNode16DeleteMiddle_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  initializer_list<int> absent_keys;
  undefined1 local_118 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  node_type_counter_array local_38;
  
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_118,false);
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_key_range<int>
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,0x80,0x11,false);
  local_38._M_elems[0] = 0x11;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 1;
  local_38._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,&local_38);
  unodb::test::
  tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
  ::
  remove<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
              *)local_118,0x85,false);
  local_38._M_elems[0] = 0;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 1;
  local_38._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_shrinking_inodes
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,(inode_type_counter_array *)&local_38);
  local_38._M_elems[0] = 0x10;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 1;
  local_38._M_elems[3] = 0;
  local_38._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,&local_38);
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118);
  local_38._M_elems[0] = 0x850000007f;
  local_38._M_elems[1] = CONCAT44(local_38._M_elems[1]._4_4_,0x91);
  absent_keys._M_len = 3;
  absent_keys._M_array = (iterator)&local_38;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>
            ((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,absent_keys);
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)local_118);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node48ShrinkToNode16DeleteMiddle) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(0x80, 17);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({17, 0, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.remove(0x85);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({0, 0, 1, 0});
  verifier.assert_node_counts({16, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.check_present_values();
  verifier.check_absent_keys({0x7F, 0x85, 0x91});
}